

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

BitReader * __thiscall
phosg::StringReader::sub_bits
          (BitReader *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  ulong uVar1;
  size_t size_00;
  
  uVar1 = this->length;
  if (uVar1 < offset || uVar1 - offset == 0) {
    BitReader::BitReader(__return_storage_ptr__);
  }
  else {
    if (uVar1 < size + offset) {
      size_00 = (uVar1 - offset) * 8;
    }
    else {
      size_00 = size << 3;
    }
    BitReader::BitReader(__return_storage_ptr__,this->data + offset,size_00,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BitReader StringReader::sub_bits(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return BitReader();
  }
  if (offset + size > this->length) {
    return BitReader(
        reinterpret_cast<const char*>(this->data) + offset,
        (this->length - offset) * 8);
  }
  return BitReader(reinterpret_cast<const char*>(this->data) + offset, size * 8);
}